

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O2

void front::irGenerator::irGenerator::outputInstructions
               (ostream *out,MirPackage *package,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
               *funcInsts)

{
  element_type *peVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
  *pmVar2;
  _Rep_type *p_Var3;
  undefined8 uVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  mapped_type *pmVar7;
  variant_alternative_t<0UL,_variant<shared_ptr<Inst>,_shared_ptr<JumpInstruction>,_shared_ptr<JumpLabelId>_>_>
  *pvVar8;
  variant_alternative_t<1UL,_variant<shared_ptr<Inst>,_shared_ptr<JumpInstruction>,_shared_ptr<JumpLabelId>_>_>
  *pvVar9;
  variant_alternative_t<2UL,_variant<shared_ptr<Inst>,_shared_ptr<JumpInstruction>,_shared_ptr<JumpLabelId>_>_>
  *pvVar10;
  pointer __rhs;
  pair<const_unsigned_int,_mir::inst::Variable> j;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
  i;
  allocator<char> local_e9;
  MirPackage *local_e8;
  _Base_ptr local_e0;
  pair<const_unsigned_int,_mir::inst::Variable> local_d8;
  _Base_ptr local_b0;
  undefined1 local_a8 [88];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_e8 = package;
  local_e0 = (_Base_ptr)funcInsts;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a8,">====== global_var ======<",(allocator<char> *)&local_d8);
  poVar5 = std::operator<<(out,(string *)local_a8);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)local_a8);
  pmVar2 = &local_e8->global_values;
  for (p_Var6 = (local_e8->global_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
            *)local_a8,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
            *)(p_Var6 + 1));
    poVar5 = std::operator<<(out,(string *)local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8," : ",(allocator<char> *)&local_50);
    std::operator<<(poVar5,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    arm::ConstValue::display((ConstValue *)(local_a8 + 0x20),out);
    std::endl<char,std::char_traits<char>>(out);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
             *)local_a8);
  }
  p_Var3 = (_Rep_type *)&local_e0->_M_color;
  local_e0 = &(((_Rep_type *)&local_e0->_M_color)->_M_impl).super__Rb_tree_header._M_header;
  local_e8 = (MirPackage *)&local_e8->functions;
  for (local_b0 = (p_Var3->_M_impl).super__Rb_tree_header._M_header._M_left; local_b0 != local_e0;
      local_b0 = (_Base_ptr)std::_Rb_tree_increment(local_b0)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
            *)local_a8,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
            *)(local_b0 + 1));
    std::operator+(&local_50,">====== function name : ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                   &local_50,"======<");
    poVar5 = std::operator<<(out,(string *)&local_d8);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_50);
    poVar5 = std::operator<<(out,">====== vars : ======<");
    std::endl<char,std::char_traits<char>>(poVar5);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
             ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                   *)local_e8,(key_type *)local_a8);
    for (p_Var6 = (pmVar7->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(pmVar7->variables)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      std::pair<const_unsigned_int,_mir::inst::Variable>::pair
                (&local_d8,(pair<const_unsigned_int,_mir::inst::Variable> *)(p_Var6 + 1));
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50," : ",&local_e9);
      std::operator<<(poVar5,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      mir::inst::Variable::display(&local_d8.second,out);
      std::endl<char,std::char_traits<char>>(out);
      mir::inst::Variable::~Variable(&local_d8.second);
    }
    poVar5 = std::operator<<(out,">====== instructions : ======<");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar4 = local_a8._40_8_;
    for (__rhs = (pointer)local_a8._32_8_; __rhs != (pointer)uVar4; __rhs = __rhs + 1) {
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                         *)&local_d8,
                        (_Copy_ctor_base<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                         *)__rhs);
      std::operator<<(out,"  ");
      if ((char)local_d8.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr == '\x01') {
        pvVar9 = std::
                 get<1ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                           ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                             *)&local_d8);
        mir::inst::JumpInstruction::display
                  ((pvVar9->
                   super___shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr,out);
      }
      else if ((char)local_d8.second.ty.
                     super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr == '\0')
      {
        pvVar8 = std::
                 get<0ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                           ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                             *)&local_d8);
        peVar1 = (pvVar8->super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        (**(peVar1->super_Displayable)._vptr_Displayable)(peVar1,out);
      }
      else {
        poVar5 = std::operator<<(out,"label ");
        pvVar10 = std::
                  get<2ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                            ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                              *)&local_d8);
        std::ostream::operator<<
                  (poVar5,((pvVar10->
                           super___shared_ptr<front::irGenerator::JumpLabelId,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->_jumpLabelId);
      }
      std::endl<char,std::char_traits<char>>(out);
      std::__detail::__variant::
      _Variant_storage<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
      ::~_Variant_storage((_Variant_storage<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                           *)&local_d8);
    }
    std::endl<char,std::char_traits<char>>(out);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
             *)local_a8);
  }
  return;
}

Assistant:

void irGenerator::outputInstructions(
    std::ostream &out, mir::inst::MirPackage &package,
    std::map<std::string, std::vector<Instruction>> funcInsts) {
  out << (string) ">====== global_var ======<" << std::endl;
  for (auto i : package.global_values) {
    out << i.first << (string) " : ";
    i.second.display(out);
    out << std::endl;
  }

  for (auto i : funcInsts) {
    out << ">====== function name : " + i.first + "======<" << std::endl;
    out << ">====== vars : ======<" << std::endl;
    for (auto j : package.functions.at(i.first).variables) {
      out << j.first << (string) " : ";
      j.second.display(out);
      out << std::endl;
    }

    out << ">====== instructions : ======<" << std::endl;

    for (auto j : i.second) {
      out << "  ";
      if (j.index() == 0) {
        get<0>(j)->display(out);
      } else if (j.index() == 1) {
        get<1>(j)->display(out);
      } else {
        out << "label " << get<2>(j)->_jumpLabelId;
      }
      out << std::endl;
    }
    out << std::endl;
  }
}